

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O1

void grpc_go_generator::anon_unknown_0::GenerateService
               (Service *service,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  long lVar1;
  undefined8 uVar2;
  pointer pcVar3;
  size_type sVar4;
  _func_int **pp_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  long lVar10;
  _Alloc_hider _Var11;
  char cVar12;
  int iVar13;
  int iVar14;
  mapped_type *pmVar15;
  long *plVar16;
  undefined8 *puVar17;
  mapped_type *pmVar18;
  long *plVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  CommentHolder *pCVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  CommentHolder *pCVar23;
  pointer *__ptr;
  uint uVar24;
  ulong uVar25;
  pointer pcVar26;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var27;
  byte bVar28;
  Service *pSVar29;
  byte bVar30;
  char *pcVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_2;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method;
  undefined1 local_3c8 [24];
  undefined3 uStack_3b0;
  undefined1 uStack_3ad;
  undefined4 uStack_3ac;
  undefined1 local_398 [24];
  undefined3 uStack_380;
  undefined1 uStack_37d;
  undefined2 uStack_37c;
  undefined1 uStack_37a;
  undefined1 uStack_379;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_368;
  undefined1 local_360 [48];
  undefined1 local_330 [8];
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [2];
  CommentHolder *local_300;
  undefined1 local_2f8 [48];
  undefined1 local_2c8 [8];
  pointer local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [2];
  key_type local_298;
  undefined1 local_278 [48];
  key_type local_248;
  int local_224;
  CommentHolder *local_220;
  Service *local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  int local_1dc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  key_type local_1a8;
  char *local_188;
  size_type local_180;
  char local_178;
  undefined7 uStack_177;
  undefined8 uStack_170;
  char *local_168;
  size_type local_160;
  char local_158;
  undefined7 uStack_157;
  undefined8 uStack_150;
  char *local_148;
  size_type local_140;
  char local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  char *local_128;
  long local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  CommentHolder *local_108;
  size_type local_100;
  CommentHolder local_f8 [2];
  key_type local_e8;
  CommentHolder *local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(&local_108,service);
  pCVar23 = local_108;
  uVar6 = stack0xfffffffffffffc4f;
  local_368 = &vars->_M_t;
  if (local_100 == 0) {
    local_3c8._0_8_ = local_3c8 + 0x10;
    local_3c8[0x16] = (undefined1)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x28);
    local_3c8[0x17] = (undefined1)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x30);
    local_3c8._20_2_ = (undefined2)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x18);
    if (local_108 == local_f8) {
      local_3c8._16_4_ =
           (undefined4)
           CONCAT71(local_f8[0]._vptr_CommentHolder._1_7_,local_f8[0]._vptr_CommentHolder._0_1_);
      uStack_3b0 = SUB83(local_f8[1]._vptr_CommentHolder,0);
      uStack_3ad = (undefined1)((ulong)local_f8[1]._vptr_CommentHolder >> 0x18);
      uStack_3ac = (undefined4)((ulong)local_f8[1]._vptr_CommentHolder >> 0x20);
    }
    else {
      local_3c8._0_8_ = local_108;
      local_3c8._16_4_ =
           (undefined4)
           CONCAT71(local_f8[0]._vptr_CommentHolder._1_7_,local_f8[0]._vptr_CommentHolder._0_1_);
      uStack_3b0 = SUB43(uVar6,1);
    }
    local_3c8._8_8_ = local_100;
  }
  else {
    iVar13 = toupper((int)*(char *)&local_108->_vptr_CommentHolder);
    uVar6 = stack0xfffffffffffffc4f;
    *(char *)&pCVar23->_vptr_CommentHolder = (char)iVar13;
    local_3c8._0_8_ = local_3c8 + 0x10;
    local_3c8[0x16] = (undefined1)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x28);
    local_3c8[0x17] = (undefined1)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x30);
    local_3c8._20_2_ = (undefined2)((uint7)local_f8[0]._vptr_CommentHolder._1_7_ >> 0x18);
    if (local_108 == local_f8) {
      local_3c8._16_4_ =
           (undefined4)
           CONCAT71(local_f8[0]._vptr_CommentHolder._1_7_,local_f8[0]._vptr_CommentHolder._0_1_);
      uStack_3b0 = SUB83(local_f8[1]._vptr_CommentHolder,0);
      uStack_3ad = (undefined1)((ulong)local_f8[1]._vptr_CommentHolder >> 0x18);
      uStack_3ac = (undefined4)((ulong)local_f8[1]._vptr_CommentHolder >> 0x20);
    }
    else {
      local_3c8._0_8_ = local_108;
      local_3c8._16_4_ =
           (undefined4)
           CONCAT71(local_f8[0]._vptr_CommentHolder._1_7_,local_f8[0]._vptr_CommentHolder._0_1_);
      uStack_3b0 = SUB43(uVar6,1);
    }
    local_3c8._8_8_ = local_100;
  }
  p_Var27 = local_368;
  local_108 = local_f8;
  local_100 = 0;
  local_f8[0]._vptr_CommentHolder._0_1_ = 0;
  local_398._0_8_ = local_398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Service","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_398);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,
                    CONCAT17(local_398[0x17],
                             CONCAT16(local_398[0x16],CONCAT24(local_398._20_2_,local_398._16_4_)))
                    + 1);
  }
  pCVar23 = (CommentHolder *)(local_3c8 + 0x10);
  if ((CommentHolder *)local_3c8._0_8_ != pCVar23) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,
                    CONCAT71(local_f8[0]._vptr_CommentHolder._1_7_,
                             local_f8[0]._vptr_CommentHolder._0_1_) + 1);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"// Client API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $Service$Client interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  local_3c8._0_8_ = pCVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Ending","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3c8);
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x375e21);
  if ((CommentHolder *)local_3c8._0_8_ != pCVar23) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  iVar13 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])(service);
  if (0 < iVar13) {
    uVar25 = 0;
    do {
      (*(service->super_CommentHolder)._vptr_CommentHolder[9])(local_3c8,service,uVar25);
      uVar2 = local_3c8._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_60,local_368);
      GenerateClientMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_3c8._0_8_)[1])();
      }
      uVar24 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])(service);
    } while ((int)uVar24 < iVar13);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  pcVar3 = local_398 + 0x10;
  local_398._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Service","");
  p_Var27 = local_368;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_368,(key_type *)local_398);
  pcVar26 = (pmVar15->_M_dataplus)._M_p;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar26,pcVar26 + pmVar15->_M_string_length);
  pcVar31 = local_128;
  uVar6 = stack0xfffffffffffffc4f;
  if (local_120 == 0) {
    local_3c8._0_8_ = local_3c8 + 0x10;
    local_3c8[0x16] = (undefined1)((uint7)uStack_117 >> 0x28);
    local_3c8[0x17] = (undefined1)((uint7)uStack_117 >> 0x30);
    local_3c8._20_2_ = (undefined2)((uint7)uStack_117 >> 0x18);
    if (local_128 == &local_118) {
      local_3c8._16_4_ = (undefined4)CONCAT71(uStack_117,local_118);
      uStack_3b0 = (undefined3)uStack_110;
      uStack_3ad = (undefined1)((ulong)uStack_110 >> 0x18);
      uStack_3ac = (undefined4)((ulong)uStack_110 >> 0x20);
    }
    else {
      local_3c8._0_8_ = local_128;
      local_3c8._16_4_ = (undefined4)CONCAT71(uStack_117,local_118);
      uStack_3b0 = SUB43(uVar6,1);
    }
  }
  else {
    iVar13 = tolower((int)*local_128);
    *pcVar31 = (char)iVar13;
    uVar6 = stack0xfffffffffffffc4f;
    local_3c8._0_8_ = local_3c8 + 0x10;
    local_3c8[0x16] = (undefined1)((uint7)uStack_117 >> 0x28);
    local_3c8[0x17] = (undefined1)((uint7)uStack_117 >> 0x30);
    local_3c8._20_2_ = (undefined2)((uint7)uStack_117 >> 0x18);
    if (local_128 == &local_118) {
      local_3c8._16_4_ = (undefined4)CONCAT71(uStack_117,local_118);
      uStack_3b0 = (undefined3)uStack_110;
      uStack_3ad = (undefined1)((ulong)uStack_110 >> 0x18);
      uStack_3ac = (undefined4)((ulong)uStack_110 >> 0x20);
    }
    else {
      local_3c8._0_8_ = local_128;
      local_3c8._16_4_ = (undefined4)CONCAT71(uStack_117,local_118);
      uStack_3b0 = SUB43(uVar6,1);
    }
    p_Var27 = local_368;
  }
  local_120 = 0;
  local_118 = '\0';
  local_360._0_8_ = local_360 + 0x10;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"ServiceUnexported","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_360);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,
                    CONCAT17(local_360[0x17],
                             CONCAT16(local_360[0x16],CONCAT24(local_360._20_2_,local_360._16_4_)))
                    + 1);
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if ((pointer)local_398._0_8_ != pcVar3) {
    operator_delete((void *)local_398._0_8_,
                    CONCAT17(local_398[0x17],
                             CONCAT16(local_398[0x16],CONCAT24(local_398._20_2_,local_398._16_4_)))
                    + 1);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $ServiceUnexported$Client struct {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"cc $grpc$.ClientConnInterface\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func New$Service$Client(cc $grpc$.ClientConnInterface) $Service$Client {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"return &$ServiceUnexported$Client{cc}");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"\n}\n\n");
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"Service","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_360);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,"_",
                 pmVar15);
  plVar16 = (long *)std::__cxx11::string::append(local_398);
  local_3c8._0_8_ = local_3c8 + 0x10;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_3c8._16_4_ = (undefined4)*plVar19;
    uVar6 = *(undefined4 *)((long)plVar16 + 0x14);
    uStack_3ac = *(undefined4 *)((long)plVar16 + 0x1c);
    local_3c8._20_2_ = (undefined2)uVar6;
    local_3c8[0x16] = (undefined1)((uint)uVar6 >> 0x10);
    uStack_3b0 = (undefined3)(int)plVar16[3];
    unique0x10004738 = CONCAT31(uStack_3b0,(char)((uint)uVar6 >> 0x18));
    uStack_3ad = (undefined1)((uint)(int)plVar16[3] >> 0x18);
  }
  else {
    lVar1 = *plVar19;
    local_3c8._16_4_ = (undefined4)lVar1;
    local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
    local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
    local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
    local_3c8._0_8_ = (long *)*plVar16;
  }
  local_3c8._8_8_ = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ServiceDesc","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_2c8);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,
                    CONCAT17(local_2b8[0]._M_local_buf[7],
                             CONCAT16(local_2b8[0]._M_local_buf[6],
                                      CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                               (undefined4)local_2b8[0]._M_allocated_capacity))) + 1
                   );
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  if ((pointer)local_398._0_8_ != pcVar3) {
    operator_delete((void *)local_398._0_8_,
                    CONCAT17(local_398[0x17],
                             CONCAT16(local_398[0x16],CONCAT24(local_398._20_2_,local_398._16_4_)))
                    + 1);
  }
  if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
    operator_delete((void *)local_360._0_8_,
                    CONCAT17(local_360[0x17],
                             CONCAT16(local_360[0x16],CONCAT24(local_360._20_2_,local_360._16_4_)))
                    + 1);
  }
  iVar13 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])(service);
  local_218 = service;
  if (0 < iVar13) {
    uVar25 = 0;
    local_224 = 0;
    local_1dc = 0;
    do {
      local_300 = (CommentHolder *)CONCAT44(local_300._4_4_,(int)uVar25);
      (*(service->super_CommentHolder)._vptr_CommentHolder[9])(&local_220,service,uVar25);
      iVar13 = (*((CommentHolder *)&local_220->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])();
      if ((char)iVar13 == '\0') {
        local_2c8 = (undefined1  [8])local_2b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ServiceDesc","");
        pcVar3 = local_360 + 0x10;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_368,(key_type *)local_2c8);
        pcVar26 = (pmVar15->_M_dataplus)._M_p;
        local_360._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,pcVar26,pcVar26 + pmVar15->_M_string_length);
        std::__cxx11::string::append((char *)local_360);
        as_string<int>((string *)local_330,local_224);
        pcVar26 = (pointer)0xf;
        if ((pointer)local_360._0_8_ != pcVar3) {
          pcVar26 = (pointer)CONCAT17(local_360[0x17],
                                      CONCAT16(local_360[0x16],
                                               CONCAT24(local_360._20_2_,local_360._16_4_)));
        }
        if (pcVar26 < local_328 + local_360._8_8_) {
          pcVar26 = (pointer)0xf;
          if (local_330 != (undefined1  [8])local_320) {
            pcVar26 = (pointer)CONCAT17(local_320[0]._M_local_buf[7],
                                        CONCAT16(local_320[0]._M_local_buf[6],
                                                 CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                          (undefined4)
                                                          local_320[0]._M_allocated_capacity)));
          }
          if (pcVar26 < local_328 + local_360._8_8_) goto LAB_00347941;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_330,0,(char *)0x0,local_360._0_8_);
        }
        else {
LAB_00347941:
          puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_360,(ulong)local_330);
        }
        pcVar26 = (pointer)(puVar17 + 2);
        if ((pointer)*puVar17 == pcVar26) {
          uVar2 = *(undefined8 *)pcVar26;
          uVar9 = puVar17[3];
          local_398._16_4_ = (undefined4)uVar2;
          local_398._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          uStack_380 = (undefined3)uVar9;
          uStack_37d = (undefined1)((ulong)uVar9 >> 0x18);
          uStack_37c = (undefined2)((ulong)uVar9 >> 0x20);
          uStack_37a = (undefined1)((ulong)uVar9 >> 0x30);
          uStack_379 = (undefined1)((ulong)uVar9 >> 0x38);
          local_398._0_8_ = local_398 + 0x10;
        }
        else {
          uVar2 = *(undefined8 *)pcVar26;
          local_398._16_4_ = (undefined4)uVar2;
          local_398._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          local_398._0_8_ = (pointer)*puVar17;
        }
        local_398._8_8_ = puVar17[1];
        *puVar17 = pcVar26;
        puVar17[1] = 0;
        *pcVar26 = '\0';
        plVar16 = (long *)std::__cxx11::string::append(local_398);
        local_3c8._0_8_ = local_3c8 + 0x10;
        plVar19 = plVar16 + 2;
        if ((long *)*plVar16 == plVar19) {
          local_3c8._16_4_ = (undefined4)*plVar19;
          uVar6 = *(undefined4 *)((long)plVar16 + 0x14);
          uStack_3ac = *(undefined4 *)((long)plVar16 + 0x1c);
          local_3c8._20_2_ = (undefined2)uVar6;
          local_3c8[0x16] = (undefined1)((uint)uVar6 >> 0x10);
          uStack_3b0 = (undefined3)(int)plVar16[3];
          unique0x10004740 = CONCAT31(uStack_3b0,(char)((uint)uVar6 >> 0x18));
          uStack_3ad = (undefined1)((uint)(int)plVar16[3] >> 0x18);
        }
        else {
          lVar1 = *plVar19;
          local_3c8._16_4_ = (undefined4)lVar1;
          local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_3c8._0_8_ = (long *)*plVar16;
        }
        local_3c8._8_8_ = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_2f8._0_8_ = local_2f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"MethodDesc","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_368,(key_type *)local_2f8);
        std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT17(local_2f8[0x17],
                                   CONCAT16(local_2f8[0x16],
                                            CONCAT15(local_2f8[0x15],
                                                     CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) +
                          1);
        }
        if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
          operator_delete((void *)local_3c8._0_8_,
                          CONCAT17(local_3c8[0x17],
                                   CONCAT16(local_3c8[0x16],
                                            CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
        }
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,
                          CONCAT17(local_320[0]._M_local_buf[7],
                                   CONCAT16(local_320[0]._M_local_buf[6],
                                            CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_320[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if ((pointer)local_360._0_8_ != pcVar3) {
          operator_delete((void *)local_360._0_8_,
                          CONCAT17(local_360[0x17],
                                   CONCAT16(local_360[0x16],
                                            CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
        }
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,
                          CONCAT17(local_2b8[0]._M_local_buf[7],
                                   CONCAT16(local_2b8[0]._M_local_buf[6],
                                            CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_2b8[0]._M_allocated_capacity)
                                           )) + 1);
        }
        local_224 = local_224 + 1;
      }
      else {
        local_2c8 = (undefined1  [8])local_2b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ServiceDesc","");
        pcVar3 = local_360 + 0x10;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_368,(key_type *)local_2c8);
        pcVar26 = (pmVar15->_M_dataplus)._M_p;
        local_360._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,pcVar26,pcVar26 + pmVar15->_M_string_length);
        std::__cxx11::string::append((char *)local_360);
        as_string<int>((string *)local_330,local_1dc);
        pcVar26 = (pointer)0xf;
        if ((pointer)local_360._0_8_ != pcVar3) {
          pcVar26 = (pointer)CONCAT17(local_360[0x17],
                                      CONCAT16(local_360[0x16],
                                               CONCAT24(local_360._20_2_,local_360._16_4_)));
        }
        if (pcVar26 < local_328 + local_360._8_8_) {
          pcVar26 = (pointer)0xf;
          if (local_330 != (undefined1  [8])local_320) {
            pcVar26 = (pointer)CONCAT17(local_320[0]._M_local_buf[7],
                                        CONCAT16(local_320[0]._M_local_buf[6],
                                                 CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                          (undefined4)
                                                          local_320[0]._M_allocated_capacity)));
          }
          if (pcVar26 < local_328 + local_360._8_8_) goto LAB_00347861;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_330,0,(char *)0x0,local_360._0_8_);
        }
        else {
LAB_00347861:
          puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_360,(ulong)local_330);
        }
        pcVar26 = (pointer)(puVar17 + 2);
        if ((pointer)*puVar17 == pcVar26) {
          uVar2 = *(undefined8 *)pcVar26;
          uVar9 = puVar17[3];
          local_398._16_4_ = (undefined4)uVar2;
          local_398._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          uStack_380 = (undefined3)uVar9;
          uStack_37d = (undefined1)((ulong)uVar9 >> 0x18);
          uStack_37c = (undefined2)((ulong)uVar9 >> 0x20);
          uStack_37a = (undefined1)((ulong)uVar9 >> 0x30);
          uStack_379 = (undefined1)((ulong)uVar9 >> 0x38);
          local_398._0_8_ = local_398 + 0x10;
        }
        else {
          uVar2 = *(undefined8 *)pcVar26;
          local_398._16_4_ = (undefined4)uVar2;
          local_398._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          local_398._0_8_ = (pointer)*puVar17;
        }
        local_398._8_8_ = puVar17[1];
        *puVar17 = pcVar26;
        puVar17[1] = 0;
        *pcVar26 = '\0';
        plVar16 = (long *)std::__cxx11::string::append(local_398);
        local_3c8._0_8_ = local_3c8 + 0x10;
        plVar19 = plVar16 + 2;
        if ((long *)*plVar16 == plVar19) {
          local_3c8._16_4_ = (undefined4)*plVar19;
          uVar6 = *(undefined4 *)((long)plVar16 + 0x14);
          uStack_3ac = *(undefined4 *)((long)plVar16 + 0x1c);
          local_3c8._20_2_ = (undefined2)uVar6;
          local_3c8[0x16] = (undefined1)((uint)uVar6 >> 0x10);
          uStack_3b0 = (undefined3)(int)plVar16[3];
          unique0x1000473c = CONCAT31(uStack_3b0,(char)((uint)uVar6 >> 0x18));
          uStack_3ad = (undefined1)((uint)(int)plVar16[3] >> 0x18);
        }
        else {
          lVar1 = *plVar19;
          local_3c8._16_4_ = (undefined4)lVar1;
          local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_3c8._0_8_ = (long *)*plVar16;
        }
        local_3c8._8_8_ = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_2f8._0_8_ = local_2f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"MethodDesc","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_368,(key_type *)local_2f8);
        std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT17(local_2f8[0x17],
                                   CONCAT16(local_2f8[0x16],
                                            CONCAT15(local_2f8[0x15],
                                                     CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) +
                          1);
        }
        if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
          operator_delete((void *)local_3c8._0_8_,
                          CONCAT17(local_3c8[0x17],
                                   CONCAT16(local_3c8[0x16],
                                            CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
        }
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,
                          CONCAT17(local_320[0]._M_local_buf[7],
                                   CONCAT16(local_320[0]._M_local_buf[6],
                                            CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_320[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if ((pointer)local_360._0_8_ != pcVar3) {
          operator_delete((void *)local_360._0_8_,
                          CONCAT17(local_360[0x17],
                                   CONCAT16(local_360[0x16],
                                            CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
        }
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,
                          CONCAT17(local_2b8[0]._M_local_buf[7],
                                   CONCAT16(local_2b8[0]._M_local_buf[6],
                                            CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_2b8[0]._M_allocated_capacity)
                                           )) + 1);
        }
        local_1dc = local_1dc + 1;
      }
      pCVar23 = local_220;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_210,local_368);
      (*printer->_vptr_Printer[2])(printer,&local_210,"func (c *$ServiceUnexported$Client) ");
      local_3c8._0_8_ = local_3c8 + 0x10;
      local_3c8._20_2_ = 0x676e;
      local_3c8._16_4_ = 0x69646e45;
      local_3c8._8_8_ = 6;
      local_3c8[0x16] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_3c8);
      std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x36d1fa);
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3c8,&local_210);
      GenerateClientMethodSignature
                ((Method *)pCVar23,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_3c8);
      (*printer->_vptr_Printer[5])(printer);
      (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[5])
                (&local_298,pCVar23);
      _Var11._M_p = local_298._M_dataplus._M_p;
      if (local_298._M_string_length == 0) {
        local_398._0_8_ = local_398 + 0x10;
        local_398._8_8_ = local_298._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p == &local_298.field_2) {
          local_398._16_4_ =
               CONCAT13(local_298.field_2._M_local_buf[3],
                        CONCAT21(local_298.field_2._M_allocated_capacity._1_2_,
                                 local_298.field_2._M_local_buf[0]));
          uStack_380 = (undefined3)local_298.field_2._8_8_;
          local_398[0x17] = local_298.field_2._M_local_buf[7];
          uStack_37d = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x18);
          uStack_37c = (undefined2)((ulong)local_298.field_2._8_8_ >> 0x20);
          uStack_37a = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x30);
          uStack_379 = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x38);
        }
        else {
          local_398._0_8_ = local_298._M_dataplus._M_p;
          local_398._16_4_ =
               CONCAT13(local_298.field_2._M_local_buf[3],
                        CONCAT21(local_298.field_2._M_allocated_capacity._1_2_,
                                 local_298.field_2._M_local_buf[0]));
          local_398[0x17] = local_298.field_2._M_local_buf[7];
        }
      }
      else {
        iVar13 = toupper((int)*local_298._M_dataplus._M_p);
        *_Var11._M_p = (char)iVar13;
        local_398._0_8_ = local_398 + 0x10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p == &local_298.field_2) {
          uStack_380 = (undefined3)local_298.field_2._8_8_;
          uStack_37d = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x18);
          uStack_37c = (undefined2)((ulong)local_298.field_2._8_8_ >> 0x20);
          uStack_37a = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x30);
          uStack_379 = (undefined1)((ulong)local_298.field_2._8_8_ >> 0x38);
        }
        else {
          local_398._0_8_ = local_298._M_dataplus._M_p;
        }
        local_398._17_2_ = local_298.field_2._M_allocated_capacity._1_2_;
        local_398[0x10] = local_298.field_2._M_local_buf[0];
        local_398[0x13] = local_298.field_2._M_local_buf[3];
        local_398[0x17] = local_298.field_2._M_local_buf[7];
        local_398._8_8_ = local_298._M_string_length;
      }
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_360._20_2_ = 0x646f;
      local_360._16_4_ = 0x6874654d;
      local_360._8_8_ = 6;
      local_360[0x16] = '\0';
      local_398._20_2_ = local_298.field_2._M_allocated_capacity._4_2_;
      local_398[0x16] = local_298.field_2._M_local_buf[6];
      local_360._0_8_ = local_360 + 0x10;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_360);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_398);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT17(local_298.field_2._M_local_buf[7],
                                 CONCAT16(local_298.field_2._M_local_buf[6],
                                          CONCAT24(local_298.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                                            CONCAT21(local_298.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_298.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      local_360._0_8_ = local_360 + 0x10;
      local_360[0x18] = 't';
      local_360._25_2_ = 0x6f68;
      local_360[0x1b] = 'd';
      local_360._28_2_ = 0x4f49;
      local_360._16_4_ = 0x74737543;
      local_360._20_2_ = 0x6d6f;
      local_360[0x16] = 'M';
      local_360[0x17] = 'e';
      local_360._8_8_ = 0xe;
      local_360[0x1e] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_360);
      iVar13 = std::__cxx11::string::compare((char *)pmVar15);
      if (iVar13 == 0) {
        (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
                  ((string *)local_398,pCVar23);
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8.field_2._8_6_ = 0x4f49646f6874;
        local_e8.field_2._M_allocated_capacity._0_6_ = 0x6d6f74737543;
        local_e8.field_2._M_allocated_capacity._6_2_ = 0x654d;
        local_e8._M_string_length = 0xe;
        local_e8.field_2._M_local_buf[0xe] = '\0';
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,&local_e8);
        local_398._0_8_ = local_398 + 0x10;
        pcVar3 = (pmVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_398,pcVar3,pcVar3 + pmVar15->_M_string_length);
      }
      pcVar3 = local_2f8 + 0x10;
      local_2b8[0]._M_allocated_capacity._4_2_ = 0x7365;
      local_2b8[0]._M_local_buf[6] = 't';
      local_2b8[0]._M_allocated_capacity._0_4_ = 0x75716552;
      local_2c0 = (pointer)0x7;
      local_2b8[0]._7_4_ = local_2b8[0]._7_4_ & 0xffffff00;
      local_2c8 = (undefined1  [8])local_2b8;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_2c8);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_398);
      if (local_2c8 != (undefined1  [8])local_2b8) {
        operator_delete((void *)local_2c8,
                        CONCAT17(local_2b8[0]._M_local_buf[7],
                                 CONCAT16(local_2b8[0]._M_local_buf[6],
                                          CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_2b8[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((iVar13 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2)) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT26(local_e8.field_2._M_allocated_capacity._6_2_,
                                 local_e8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])
                (local_398,pCVar23);
      local_360._16_4_ = 0x70736552;
      local_360._20_2_ = 0x6e6f;
      local_360[0x16] = 's';
      local_360[0x17] = 'e';
      local_360._8_8_ = 8;
      local_360[0x18] = '\0';
      local_360._0_8_ = local_360 + 0x10;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_360);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_398);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      local_2f8._24_2_ = 0x6572;
      local_2f8[0x1a] = 'f';
      local_2f8[0x1b] = 'i';
      local_2f8[0x1c] = 'x';
      local_2f8._16_4_ = 0x76726553;
      local_2f8[0x14] = 'i';
      local_2f8[0x15] = 'c';
      local_2f8[0x16] = 'e';
      local_2f8[0x17] = 'P';
      local_2f8._8_8_ = 0xd;
      local_2f8[0x1d] = '\0';
      local_2f8._0_8_ = pcVar3;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_2f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     "/",pmVar15);
      local_278._0_8_ = local_278 + 0x10;
      local_278[0x14] = 'i';
      local_278._21_2_ = 0x6563;
      local_278._16_4_ = 0x76726553;
      local_278._8_8_ = 7;
      local_278[0x17] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,(key_type *)local_278);
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append(local_330,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_2c8 = (undefined1  [8])local_2b8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 == paVar20) {
        sVar4 = paVar20->_M_allocated_capacity;
        uVar2 = puVar17[3];
        local_2b8[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_2b8[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_2b8[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_2b8[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_2b8[0]._8_3_ = (undefined3)uVar2;
        local_2b8[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar2 >> 0x18);
        local_2b8[0]._12_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_2b8[0]._M_local_buf[0xe] = (undefined1)((ulong)uVar2 >> 0x30);
        local_2b8[0]._M_local_buf[0xf] = (undefined1)((ulong)uVar2 >> 0x38);
      }
      else {
        sVar4 = paVar20->_M_allocated_capacity;
        local_2b8[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_2b8[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_2b8[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_2b8[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_2c8 = (undefined1  [8])*puVar17;
      }
      local_2c0 = (pointer)puVar17[1];
      *puVar17 = paVar20;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append(local_2c8);
      local_360._0_8_ = local_360 + 0x10;
      pCVar21 = (CommentHolder *)(puVar17 + 2);
      if ((CommentHolder *)*puVar17 == pCVar21) {
        pp_Var5 = pCVar21->_vptr_CommentHolder;
        uVar2 = puVar17[3];
        local_360._16_4_ = SUB84(pp_Var5,0);
        local_360._20_2_ = (undefined2)((ulong)pp_Var5 >> 0x20);
        local_360[0x16] = (undefined1)((ulong)pp_Var5 >> 0x30);
        local_360[0x17] = (undefined1)((ulong)pp_Var5 >> 0x38);
        local_360[0x18] = (undefined1)uVar2;
        local_360._25_2_ = (undefined2)((ulong)uVar2 >> 8);
        local_360[0x1b] = (undefined1)((ulong)uVar2 >> 0x18);
        local_360._28_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_360[0x1e] = (undefined1)((ulong)uVar2 >> 0x30);
        local_360[0x1f] = (undefined1)((ulong)uVar2 >> 0x38);
      }
      else {
        pp_Var5 = pCVar21->_vptr_CommentHolder;
        local_360._16_4_ = SUB84(pp_Var5,0);
        local_360._20_2_ = (undefined2)((ulong)pp_Var5 >> 0x20);
        local_360[0x16] = (undefined1)((ulong)pp_Var5 >> 0x30);
        local_360[0x17] = (undefined1)((ulong)pp_Var5 >> 0x38);
        local_360._0_8_ = (CommentHolder *)*puVar17;
      }
      local_360._8_8_ = puVar17[1];
      *puVar17 = pCVar21;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_248.field_2._M_allocated_capacity._0_4_ = 0x6874654d;
      local_248._M_string_length = 6;
      local_248.field_2._M_local_buf[6] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,&local_248);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  (local_360,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_398._0_8_ = local_398 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_380 = (undefined3)lVar10;
        uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
        uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
        uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
      }
      else {
        lVar1 = *plVar19;
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_398._0_8_ = (long *)*plVar16;
      }
      local_398._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_1a8.field_2._8_6_ = 0x656d614e646f;
      local_1a8.field_2._M_allocated_capacity._0_6_ = 0x654d6c6c7546;
      local_1a8.field_2._M_allocated_capacity._6_2_ = 0x6874;
      local_1a8._M_string_length = 0xe;
      local_1a8.field_2._M_local_buf[0xe] = '\0';
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_210,&local_1a8);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT26(local_1a8.field_2._M_allocated_capacity._6_2_,
                                 local_1a8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT17(local_248.field_2._M_local_buf[7],
                                 CONCAT16(local_248.field_2._M_local_buf[6],
                                          CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                                   local_248.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      if (local_2c8 != (undefined1  [8])local_2b8) {
        operator_delete((void *)local_2c8,
                        CONCAT17(local_2b8[0]._M_local_buf[7],
                                 CONCAT16(local_2b8[0]._M_local_buf[6],
                                          CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_2b8[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,
                        CONCAT17(local_278[0x17],
                                 CONCAT25(local_278._21_2_,
                                          CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
      }
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((pointer)local_2f8._0_8_ != pcVar3) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT17(local_2f8[0x17],
                                 CONCAT16(local_2f8[0x16],
                                          CONCAT15(local_2f8[0x15],
                                                   CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) + 1
                       );
      }
      iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])
                         (pCVar23);
      if ((char)iVar13 == '\0') {
        local_c8 = pCVar23;
        local_2c8 = (undefined1  [8])local_2b8;
        local_330 = (undefined1  [8])0x11;
        local_2c8 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_330);
        local_2b8[0]._M_allocated_capacity._0_4_ = local_330._0_4_;
        local_2b8[0]._M_allocated_capacity._4_2_ = local_330._4_2_;
        local_2b8[0]._M_local_buf[6] = local_330[6];
        local_2b8[0]._M_local_buf[7] = local_330[7];
        *(undefined8 *)local_2c8 = 0x5565636976726553;
        *(char *)((long)local_2c8 + 8) = 'n';
        *(char *)((long)local_2c8 + 9) = 'e';
        *(char *)((long)local_2c8 + 10) = 'x';
        *(char *)((long)local_2c8 + 0xb) = 'p';
        *(char *)((long)local_2c8 + 0xc) = 'o';
        *(char *)((long)local_2c8 + 0xd) = 'r';
        *(char *)((long)local_2c8 + 0xe) = 't';
        *(char *)((long)local_2c8 + 0xf) = 'e';
        *(char *)((long)local_2c8 + 0x10) = 'd';
        local_2c0 = (pointer)local_330;
        *(char *)((long)local_2c8 + (long)local_330) = '\0';
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,(key_type *)local_2c8);
        local_320[0]._M_allocated_capacity._4_2_ = 0x646f;
        local_320[0]._M_allocated_capacity._0_4_ = 0x6874654d;
        local_328 = (pointer)0x6;
        local_320[0]._M_local_buf[6] = '\0';
        local_330 = (undefined1  [8])local_320;
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,(key_type *)local_330);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,pmVar15,pmVar18);
        plVar16 = (long *)std::__cxx11::string::append((char *)local_360);
        local_398._0_8_ = local_398 + 0x10;
        plVar19 = plVar16 + 2;
        if ((long *)*plVar16 == plVar19) {
          lVar1 = *plVar19;
          lVar10 = plVar16[3];
          local_398._16_4_ = (undefined4)lVar1;
          local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          uStack_380 = (undefined3)lVar10;
          uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
          uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
          uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
          uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
        }
        else {
          lVar1 = *plVar19;
          local_398._16_4_ = (undefined4)lVar1;
          local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_398._0_8_ = (long *)*plVar16;
        }
        local_398._8_8_ = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_2f8._16_4_ = 0x65727453;
        local_2f8[0x14] = 'a';
        local_2f8[0x15] = 'm';
        local_2f8[0x16] = 'T';
        local_2f8[0x17] = 'y';
        local_2f8._24_2_ = 0x6570;
        local_2f8._8_8_ = 10;
        local_2f8[0x1a] = '\0';
        local_2f8._0_8_ = pcVar3;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,(key_type *)local_2f8);
        std::__cxx11::string::operator=((string *)pmVar15,(string *)local_398);
        if ((pointer)local_2f8._0_8_ != pcVar3) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT17(local_2f8[0x17],
                                   CONCAT16(local_2f8[0x16],
                                            CONCAT15(local_2f8[0x15],
                                                     CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) +
                          1);
        }
        pCVar23 = local_c8;
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
          operator_delete((void *)local_360._0_8_,
                          CONCAT17(local_360[0x17],
                                   CONCAT16(local_360[0x16],
                                            CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
        }
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,
                          CONCAT17(local_320[0]._M_local_buf[7],
                                   CONCAT16(local_320[0]._M_local_buf[6],
                                            CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_320[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,
                          CONCAT17(local_2b8[0]._M_local_buf[7],
                                   CONCAT16(local_2b8[0]._M_local_buf[6],
                                            CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_2b8[0]._M_allocated_capacity)
                                           )) + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_210,
                   "stream, err := c.cc.NewStream(ctx, &$MethodDesc$, \"$FullMethodName$\", opts...)\n"
                  );
        local_398._0_8_ = local_398 + 0x10;
        local_398._16_4_ = 0x6f727245;
        local_398._20_2_ = 0x5f72;
        local_398[0x16] = 'C';
        stack0xfffffffffffffc7f = 0x6b636568;
        local_398._8_8_ = 0xb;
        uStack_37d = '\0';
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,(key_type *)local_398);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fea4);
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_398,&local_210);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_398,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_398);
        (*printer->_vptr_Printer[2])(printer,&local_210,"x := &$StreamType${stream}\n");
        iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar23);
        if (((char)iVar13 == '\0') &&
           (iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar23), (char)iVar13 != '\0')) {
          local_360._0_8_ = local_360 + 0x10;
          local_360._16_4_ = 0x6f727245;
          local_360._20_2_ = 0x5f72;
          local_360[0x16] = 'C';
          local_360[0x17] = 'h';
          local_360[0x18] = 'e';
          local_360._25_2_ = 0x6b63;
          local_360._8_8_ = 0xb;
          local_360[0x1b] = '\0';
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_210,(key_type *)local_360);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fe53);
          if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
            operator_delete((void *)local_360._0_8_,
                            CONCAT17(local_360[0x17],
                                     CONCAT16(local_360[0x16],
                                              CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_360,&local_210);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_360,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_360);
          local_2b8[0]._M_allocated_capacity._0_4_ = 0x6f727245;
          local_2b8[0]._M_allocated_capacity._4_2_ = 0x5f72;
          local_2b8[0]._M_local_buf[6] = 'C';
          local_2b8[0]._7_4_ = 0x6b636568;
          local_2c0 = (pointer)0xb;
          local_2b8[0]._M_local_buf[0xb] = '\0';
          local_2c8 = (undefined1  [8])local_2b8;
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_210,(key_type *)local_2c8);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fe81);
          if (local_2c8 != (undefined1  [8])local_2b8) {
            operator_delete((void *)local_2c8,
                            CONCAT17(local_2b8[0]._M_local_buf[7],
                                     CONCAT16(local_2b8[0]._M_local_buf[6],
                                              CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_2b8[0]._M_allocated_capacity))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2c8,&local_210);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2c8,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_2c8);
        }
        (*printer->_vptr_Printer[3])(printer,"return x, nil\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar23);
        bVar30 = 1;
        if ((char)iVar13 == '\0') {
          iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar23);
          if ((char)iVar13 == '\0') {
            bVar30 = 0;
          }
          else {
            iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar23);
            bVar30 = (byte)iVar13 ^ 1;
          }
        }
        iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar23);
        cVar12 = '\x01';
        if ((char)iVar13 == '\0') {
          iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar23);
          if ((char)iVar13 == '\0') {
            iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar23);
            cVar12 = (char)iVar13;
          }
          else {
            cVar12 = '\0';
          }
        }
        iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar23);
        if ((char)iVar13 == '\0') {
          bVar28 = 0;
        }
        else {
          iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             (pCVar23);
          bVar28 = (byte)iVar13 ^ 1;
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_210,"type $Service$_$Method$Client interface {\n");
        (*printer->_vptr_Printer[5])(printer);
        if (bVar30 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_210,"Send(*$Request$) error\n");
        }
        if (cVar12 != '\0') {
          (*printer->_vptr_Printer[2])(printer,&local_210,"Recv() (*$Response$, error)\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_210,"CloseAndRecv() (*$Response$, error)\n");
        }
        (*printer->_vptr_Printer[2])(printer,&local_210,"$grpc$.ClientStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        (*printer->_vptr_Printer[2])(printer,&local_210,"type $StreamType$ struct {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_210,"$grpc$.ClientStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        if (bVar30 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_210,"func (x *$StreamType$) Send(m *$Request$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[3])(printer,"return x.ClientStream.SendMsg(m)\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (cVar12 != '\0') {
          (*printer->_vptr_Printer[2])
                    (printer,&local_210,"func (x *$StreamType$) Recv() (*$Response$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])(printer,&local_210,"m := new($Response$)\n");
          local_320[0]._M_allocated_capacity._0_4_ = 0x6f727245;
          local_320[0]._M_allocated_capacity._4_2_ = 0x5f72;
          local_320[0]._M_local_buf[6] = 'C';
          local_320[0]._M_local_buf[7] = 'h';
          local_320[0]._M_local_buf[8] = 'e';
          local_320[0]._9_2_ = 0x6b63;
          local_328 = (pointer)0xb;
          local_320[0]._M_local_buf[0xb] = '\0';
          local_330 = (undefined1  [8])local_320;
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_210,(key_type *)local_330);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fff8);
          if (local_330 != (undefined1  [8])local_320) {
            operator_delete((void *)local_330,
                            CONCAT17(local_320[0]._M_local_buf[7],
                                     CONCAT16(local_320[0]._M_local_buf[6],
                                              CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_320[0]._M_allocated_capacity))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_330,&local_210);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_330,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_330);
          (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_210,
                     "func (x *$StreamType$) CloseAndRecv() (*$Response$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          local_2f8._16_4_ = 0x6f727245;
          local_2f8[0x14] = 'r';
          local_2f8[0x15] = '_';
          local_2f8[0x16] = 'C';
          local_2f8[0x17] = 'h';
          local_2f8._24_2_ = 0x6365;
          local_2f8[0x1a] = 'k';
          local_2f8._8_8_ = 0xb;
          local_2f8[0x1b] = '\0';
          local_2f8._0_8_ = pcVar3;
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_210,(key_type *)local_2f8);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fe81);
          if ((pointer)local_2f8._0_8_ != pcVar3) {
            operator_delete((void *)local_2f8._0_8_,
                            CONCAT17(local_2f8[0x17],
                                     CONCAT16(local_2f8[0x16],
                                              CONCAT15(local_2f8[0x15],
                                                       CONCAT14(local_2f8[0x14],local_2f8._16_4_))))
                            + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2f8,&local_210);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2f8,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_2f8);
          (*printer->_vptr_Printer[2])(printer,&local_210,"m := new($Response$)\n");
          local_278._0_8_ = local_278 + 0x10;
          local_278._16_4_ = 0x6f727245;
          local_278[0x14] = 'r';
          local_278._21_2_ = 0x435f;
          local_278[0x17] = 'h';
          local_278._24_2_ = 0x6365;
          local_278[0x1a] = 'k';
          local_278._8_8_ = 0xb;
          local_278[0x1b] = '\0';
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_210,(key_type *)local_278);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fff8);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,
                            CONCAT17(local_278[0x17],
                                     CONCAT25(local_278._21_2_,
                                              CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_278,&local_210);
          p_Var27 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_278;
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)p_Var27,true);
          pcVar31 = "return m, nil\n";
          goto LAB_00348f0e;
        }
      }
      else {
        (*printer->_vptr_Printer[2])(printer,&local_210,"out := new($Response$)\n");
        (*printer->_vptr_Printer[2])
                  (printer,&local_210,
                   "err := c.cc.Invoke(ctx, \"$FullMethodName$\", in, out, opts...)\n");
        local_398._16_4_ = 0x6f727245;
        local_398._20_2_ = 0x5f72;
        local_398[0x16] = 'C';
        stack0xfffffffffffffc7f = 0x6b636568;
        local_398._8_8_ = 0xb;
        uStack_37d = '\0';
        local_398._0_8_ = local_398 + 0x10;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_210,(key_type *)local_398);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x38fea4);
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_398,&local_210);
        p_Var27 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_398;
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)p_Var27,true);
        pcVar31 = "return out, nil\n";
LAB_00348f0e:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(p_Var27);
        (*printer->_vptr_Printer[3])(printer,pcVar31);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_210);
      if (local_220 != (CommentHolder *)0x0) {
        (*((CommentHolder *)&local_220->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
      }
      service = local_218;
      uVar24 = (int)local_300 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(local_218->super_CommentHolder)._vptr_CommentHolder[8])(local_218);
    } while ((int)uVar24 < iVar13);
  }
  p_Var27 = local_368;
  (*printer->_vptr_Printer[2])(printer,local_368,"// Server API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  local_3c8._0_8_ = (CommentHolder *)(local_3c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Ending","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3c8);
  pSVar29 = local_218;
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x375e21);
  if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)(local_3c8 + 0x10)) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
  if (0 < iVar13) {
    uVar25 = 0;
    do {
      (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[9])(local_3c8,pSVar29,uVar25);
      uVar2 = local_3c8._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_90,local_368);
      GenerateServerMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_3c8._0_8_)[1])();
      }
      uVar24 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
    } while ((int)uVar24 < iVar13);
  }
  p_Var27 = local_368;
  (*printer->_vptr_Printer[2])(printer,local_368,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type Unimplemented$Service$Server struct {\n");
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  local_3c8._0_8_ = local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Ending","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3c8);
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x36d1fa);
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,
                    CONCAT17(local_3c8[0x17],
                             CONCAT16(local_3c8[0x16],CONCAT24(local_3c8._20_2_,local_3c8._16_4_)))
                    + 1);
  }
  iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
  if (0 < iVar13) {
    uVar25 = 0;
    do {
      (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[9])(local_360,pSVar29,uVar25);
      (*(*(_func_int ***)local_360._0_8_)[5])(&local_168);
      pcVar31 = local_168;
      uVar6 = stack0xfffffffffffffc4f;
      if (local_160 == 0) {
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_157 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_157 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_157 >> 0x18);
        local_3c8._8_8_ = local_160;
        if (local_168 == &local_158) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_157,local_158);
          uStack_3b0 = (undefined3)uStack_150;
          uStack_3ad = (undefined1)((ulong)uStack_150 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_150 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_168;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_157,local_158);
          uStack_3b0 = SUB43(uVar6,1);
        }
      }
      else {
        iVar13 = toupper((int)*local_168);
        uVar6 = stack0xfffffffffffffc4f;
        *pcVar31 = (char)iVar13;
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_157 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_157 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_157 >> 0x18);
        if (local_168 == &local_158) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_157,local_158);
          uStack_3b0 = (undefined3)uStack_150;
          uStack_3ad = (undefined1)((ulong)uStack_150 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_150 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_168;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_157,local_158);
          uStack_3b0 = SUB43(uVar6,1);
        }
        local_3c8._8_8_ = local_160;
      }
      local_168 = &local_158;
      local_160 = 0;
      local_158 = '\0';
      local_398._0_8_ = local_398 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Method","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,(key_type *)local_398);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
      }
      cVar12 = (**(code **)((long)*(CommentHolder *)local_360._0_8_ + 0x78))();
      pcVar31 = "";
      if (cVar12 != '\0') {
        pcVar31 = "nil, ";
      }
      local_3c8._0_8_ = local_3c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Nil","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_368,(key_type *)local_3c8);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar31);
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      (*printer->_vptr_Printer[2])(printer,local_368,"func (Unimplemented$Service$Server) ");
      uVar2 = local_360._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_c0,local_368);
      GenerateServerMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_c0);
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])
                (printer,local_368,
                 "return $Nil$status.Errorf(codes.Unimplemented, \"method $Method$ not implemented\")\n"
                );
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n");
      (*printer->_vptr_Printer[3])(printer,"\n");
      if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_360._0_8_)[1])();
      }
      pSVar29 = local_218;
      uVar24 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(local_218->super_CommentHolder)._vptr_CommentHolder[8])(local_218);
      p_Var27 = local_368;
    } while ((int)uVar24 < iVar13);
  }
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func (Unimplemented$Service$Server) mustEmbedUnimplemented$Service$Server() {}");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type Unsafe$Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv $Service$Server) {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"s.RegisterService(&$ServiceDesc$, srv)\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
  if (0 < iVar13) {
    iVar13 = 0;
    do {
      local_224 = iVar13;
      (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[9])(&local_220,pSVar29);
      pCVar23 = local_220;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_1d8,p_Var27);
      local_300 = pCVar23;
      (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[5])(local_360,pCVar23)
      ;
      uVar2 = local_360._0_8_;
      if (local_360._8_8_ == 0) {
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8._8_8_ = local_360._8_8_;
        if ((CommentHolder *)local_360._0_8_ == (CommentHolder *)(local_360 + 0x10)) {
          uStack_3b0._1_2_ = local_360._25_2_;
          uStack_3b0._0_1_ = local_360[0x18];
          uStack_3ac = CONCAT13(local_360[0x1f],CONCAT12(local_360[0x1e],local_360._28_2_));
          local_3c8[0x17] = local_360[0x17];
          uStack_3ad = local_360[0x1b];
        }
        else {
          local_3c8._0_8_ = local_360._0_8_;
          local_3c8[0x17] = local_360[0x17];
        }
      }
      else {
        iVar13 = toupper((int)*(char *)local_360._0_8_);
        *(char *)uVar2 = (char)iVar13;
        local_3c8._0_8_ = local_3c8 + 0x10;
        if ((CommentHolder *)local_360._0_8_ == (CommentHolder *)(local_360 + 0x10)) {
          uStack_3b0 = CONCAT21(local_360._25_2_,local_360[0x18]);
          uStack_3ac = CONCAT13(local_360[0x1f],CONCAT12(local_360[0x1e],local_360._28_2_));
          uStack_3ad = local_360[0x1b];
        }
        else {
          local_3c8._0_8_ = local_360._0_8_;
        }
        local_3c8[0x17] = local_360[0x17];
        local_3c8._8_8_ = local_360._8_8_;
      }
      pCVar23 = local_300;
      local_3c8._16_4_ = local_360._16_4_;
      local_360._0_8_ = local_360 + 0x10;
      local_360._8_8_ = 0;
      local_360._16_4_ = local_360._16_4_ & 0xffffff00;
      local_398._20_2_ = 0x646f;
      local_398._16_4_ = 0x6874654d;
      local_398._8_8_ = 6;
      local_398[0x16] = '\0';
      local_3c8._20_2_ = local_360._20_2_;
      local_3c8[0x16] = local_360[0x16];
      local_398._0_8_ = local_398 + 0x10;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_398);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
                (local_3c8,pCVar23);
      local_398._20_2_ = 0x7365;
      local_398[0x16] = 't';
      local_398._16_4_ = 0x75716552;
      local_398._8_8_ = 7;
      stack0xfffffffffffffc7f = stack0xfffffffffffffc7f & 0xffffff00;
      local_398._0_8_ = local_398 + 0x10;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_398);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      local_398._0_8_ = local_398 + 0x10;
      uStack_37d = 'd';
      uStack_37c = 0x4f49;
      local_398._16_4_ = 0x74737543;
      local_398._20_2_ = 0x6d6f;
      local_398[0x16] = 'M';
      stack0xfffffffffffffc7f = 0x6f687465;
      local_398._8_8_ = 0xe;
      uStack_37a = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_398);
      iVar13 = std::__cxx11::string::compare((char *)pmVar15);
      if (iVar13 == 0) {
        (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])(local_3c8);
      }
      else {
        local_2b8[0]._M_local_buf[0xb] = 'd';
        local_2b8[0]._12_2_ = 0x4f49;
        local_2b8[0]._M_allocated_capacity._0_4_ = 0x74737543;
        local_2b8[0]._M_allocated_capacity._4_2_ = 0x6d6f;
        local_2b8[0]._M_local_buf[6] = 'M';
        local_2b8[0]._7_4_ = 0x6f687465;
        local_2c0 = (pointer)0xe;
        local_2b8[0]._M_local_buf[0xe] = '\0';
        local_2c8 = (undefined1  [8])local_2b8;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d8,(key_type *)local_2c8);
        local_3c8._0_8_ = local_3c8 + 0x10;
        pcVar3 = (pmVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3c8,pcVar3,pcVar3 + pmVar15->_M_string_length);
      }
      local_320[0]._M_allocated_capacity._0_4_ = 0x70736552;
      local_320[0]._M_allocated_capacity._4_2_ = 0x6e6f;
      local_320[0]._M_local_buf[6] = 's';
      local_320[0]._M_local_buf[7] = 'e';
      local_328 = (pointer)0x8;
      local_320[0]._M_local_buf[8] = '\0';
      local_330 = (undefined1  [8])local_320;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((CommentHolder *)local_3c8._0_8_ != (CommentHolder *)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      paVar20 = &local_298.field_2;
      if ((iVar13 != 0) && (local_2c8 != (undefined1  [8])local_2b8)) {
        operator_delete((void *)local_2c8,
                        CONCAT17(local_2b8[0]._M_local_buf[7],
                                 CONCAT16(local_2b8[0]._M_local_buf[6],
                                          CONCAT24(local_2b8[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_2b8[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      local_278._24_2_ = 0x6572;
      local_278[0x1a] = 'f';
      local_278[0x1b] = 'i';
      local_278[0x1c] = 'x';
      local_278._16_4_ = 0x76726553;
      local_278[0x14] = 'i';
      local_278._21_2_ = 0x6563;
      local_278[0x17] = 'P';
      local_278._8_8_ = 0xd;
      local_278[0x1d] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_278);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     "/",pmVar15);
      local_298.field_2._M_allocated_capacity._4_2_ = 0x6369;
      local_298.field_2._M_local_buf[6] = 'e';
      local_298.field_2._M_local_buf[0] = 'S';
      local_298.field_2._M_allocated_capacity._1_2_ = 0x7265;
      local_298.field_2._M_local_buf[3] = 'v';
      local_298._M_string_length = 7;
      local_298.field_2._M_local_buf[7] = '\0';
      local_298._M_dataplus._M_p = (pointer)paVar20;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,&local_298);
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append(local_2f8,(ulong)(pmVar15->_M_dataplus)._M_p);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 == paVar22) {
        sVar4 = paVar22->_M_allocated_capacity;
        uVar2 = puVar17[3];
        local_320[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_320[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_320[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_320[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_320[0]._M_local_buf[8] = (undefined1)uVar2;
        local_320[0]._9_2_ = (undefined2)((ulong)uVar2 >> 8);
        local_320[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar2 >> 0x18);
        local_320[0]._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        local_330 = (undefined1  [8])local_320;
      }
      else {
        sVar4 = paVar22->_M_allocated_capacity;
        local_320[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_320[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_320[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_320[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_330 = (undefined1  [8])*puVar17;
      }
      local_328 = (pointer)puVar17[1];
      *puVar17 = paVar22;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_330);
      local_398._0_8_ = local_398 + 0x10;
      plVar19 = plVar16 + 2;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_380 = (undefined3)lVar10;
        uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
        uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
        uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
      }
      else {
        lVar1 = *plVar19;
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_398._0_8_ = (long *)*plVar16;
      }
      local_398._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_248.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_248.field_2._M_allocated_capacity._0_4_ = 0x6874654d;
      local_248._M_string_length = 6;
      local_248.field_2._M_local_buf[6] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,&local_248);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  (local_398,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_3c8._0_8_ = local_3c8 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_3b0 = (undefined3)lVar10;
        uStack_3ad = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_3ac = (undefined4)((ulong)lVar10 >> 0x20);
      }
      else {
        lVar1 = *plVar19;
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3c8._0_8_ = (long *)*plVar16;
      }
      local_3c8._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_1a8.field_2._8_6_ = 0x656d614e646f;
      local_1a8.field_2._M_allocated_capacity._0_6_ = 0x654d6c6c7546;
      local_1a8.field_2._M_allocated_capacity._6_2_ = 0x6874;
      local_1a8._M_string_length = 0xe;
      local_1a8.field_2._M_local_buf[0xe] = '\0';
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,&local_1a8);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT26(local_1a8.field_2._M_allocated_capacity._6_2_,
                                 local_1a8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT17(local_248.field_2._M_local_buf[7],
                                 CONCAT16(local_248.field_2._M_local_buf[6],
                                          CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                                   local_248.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar20) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT17(local_298.field_2._M_local_buf[7],
                                 CONCAT16(local_298.field_2._M_local_buf[6],
                                          CONCAT24(local_298.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                                            CONCAT21(local_298.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_298.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT17(local_2f8[0x17],
                                 CONCAT16(local_2f8[0x16],
                                          CONCAT15(local_2f8[0x15],
                                                   CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) + 1
                       );
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,
                        CONCAT17(local_278[0x17],
                                 CONCAT25(local_278._21_2_,
                                          CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      local_278[0x14] = 'i';
      local_278._21_2_ = 0x6563;
      local_278._16_4_ = 0x76726553;
      local_278._8_8_ = 7;
      local_278[0x17] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,(key_type *)local_278);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     "_",pmVar15);
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)local_2f8);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 == paVar22) {
        sVar4 = paVar22->_M_allocated_capacity;
        uVar2 = puVar17[3];
        local_320[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_320[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_320[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_320[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_320[0]._M_local_buf[8] = (undefined1)uVar2;
        local_320[0]._9_2_ = (undefined2)((ulong)uVar2 >> 8);
        local_320[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar2 >> 0x18);
        local_320[0]._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        local_330 = (undefined1  [8])local_320;
      }
      else {
        sVar4 = paVar22->_M_allocated_capacity;
        local_320[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_320[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_320[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_320[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_330 = (undefined1  [8])*puVar17;
      }
      local_328 = (pointer)puVar17[1];
      *puVar17 = paVar22;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      local_298.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_298.field_2._M_local_buf[0] = 'M';
      local_298.field_2._M_allocated_capacity._1_2_ = 0x7465;
      local_298.field_2._M_local_buf[3] = 'h';
      local_298._M_string_length = 6;
      local_298.field_2._M_local_buf[6] = '\0';
      local_298._M_dataplus._M_p = (pointer)paVar20;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,&local_298);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  (local_330,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_398._0_8_ = local_398 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_380 = (undefined3)lVar10;
        uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
        uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
        uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
      }
      else {
        lVar1 = *plVar19;
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_398._0_8_ = (long *)*plVar16;
      }
      local_398._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_398);
      p_Var27 = local_368;
      local_3c8._0_8_ = local_3c8 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_3b0 = (undefined3)lVar10;
        uStack_3ad = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_3ac = (undefined4)((ulong)lVar10 >> 0x20);
      }
      else {
        lVar1 = *plVar19;
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3c8._0_8_ = (long *)*plVar16;
      }
      local_3c8._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_248.field_2._M_allocated_capacity._4_2_ = 0x656c;
      local_248.field_2._M_local_buf[6] = 'r';
      local_248.field_2._M_allocated_capacity._0_4_ = 0x646e6148;
      local_248._M_string_length = 7;
      local_248.field_2._M_local_buf[7] = '\0';
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d8,&local_248);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT17(local_248.field_2._M_local_buf[7],
                                 CONCAT16(local_248.field_2._M_local_buf[6],
                                          CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                                   local_248.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar20) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT17(local_298.field_2._M_local_buf[7],
                                 CONCAT16(local_298.field_2._M_local_buf[6],
                                          CONCAT24(local_298.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                                            CONCAT21(local_298.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_298.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      pCVar23 = local_300;
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT17(local_2f8[0x17],
                                 CONCAT16(local_2f8[0x16],
                                          CONCAT15(local_2f8[0x15],
                                                   CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) + 1
                       );
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,
                        CONCAT17(local_278[0x17],
                                 CONCAT25(local_278._21_2_,
                                          CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
      }
      iVar13 = (*((CommentHolder *)&pCVar23->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])
                         (pCVar23);
      if ((char)iVar13 == '\0') {
        local_2f8._0_8_ = (pointer)0x11;
        local_330 = (undefined1  [8])local_320;
        local_330 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_330,(ulong)local_2f8);
        local_320[0]._M_allocated_capacity._0_4_ = (undefined4)local_2f8._0_8_;
        local_320[0]._M_allocated_capacity._4_2_ = SUB82(local_2f8._0_8_,4);
        local_320[0]._M_local_buf[6] = SUB81(local_2f8._0_8_,6);
        local_320[0]._M_local_buf[7] = SUB81(local_2f8._0_8_,7);
        *(undefined8 *)local_330 = 0x5565636976726553;
        *(char *)((long)local_330 + 8) = 'n';
        *(char *)((long)local_330 + 9) = 'e';
        *(char *)((long)local_330 + 10) = 'x';
        *(char *)((long)local_330 + 0xb) = 'p';
        *(char *)((long)local_330 + 0xc) = 'o';
        *(char *)((long)local_330 + 0xd) = 'r';
        *(char *)((long)local_330 + 0xe) = 't';
        *(char *)((long)local_330 + 0xf) = 'e';
        *(char *)((long)local_330 + 0x10) = 'd';
        local_328 = (pointer)local_2f8._0_8_;
        *(char *)((long)local_330 + local_2f8._0_8_) = '\0';
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d8,(key_type *)local_330);
        local_2f8._0_8_ = local_2f8 + 0x10;
        local_2f8[0x14] = 'o';
        local_2f8[0x15] = 'd';
        local_2f8._16_4_ = 0x6874654d;
        local_2f8._8_8_ = 6;
        local_2f8[0x16] = '\0';
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d8,(key_type *)local_2f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,pmVar15,pmVar18);
        plVar16 = (long *)std::__cxx11::string::append((char *)local_398);
        local_3c8._0_8_ = local_3c8 + 0x10;
        plVar19 = plVar16 + 2;
        if ((long *)*plVar16 == plVar19) {
          lVar1 = *plVar19;
          lVar10 = plVar16[3];
          local_3c8._16_4_ = (undefined4)lVar1;
          local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          uStack_3b0 = (undefined3)lVar10;
          uStack_3ad = (undefined1)((ulong)lVar10 >> 0x18);
          uStack_3ac = (undefined4)((ulong)lVar10 >> 0x20);
        }
        else {
          lVar1 = *plVar19;
          local_3c8._16_4_ = (undefined4)lVar1;
          local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_3c8._0_8_ = (long *)*plVar16;
        }
        local_3c8._8_8_ = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_278._16_4_ = 0x65727453;
        local_278[0x14] = 'a';
        local_278._21_2_ = 0x546d;
        local_278[0x17] = 'y';
        local_278._24_2_ = 0x6570;
        local_278._8_8_ = 10;
        local_278[0x1a] = '\0';
        local_278._0_8_ = local_278 + 0x10;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d8,(key_type *)local_278);
        std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,
                          CONCAT17(local_278[0x17],
                                   CONCAT25(local_278._21_2_,
                                            CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
        }
        if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
          operator_delete((void *)local_3c8._0_8_,
                          CONCAT17(local_3c8[0x17],
                                   CONCAT16(local_3c8[0x16],
                                            CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
        }
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,
                          CONCAT17(local_398[0x17],
                                   CONCAT16(local_398[0x16],
                                            CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
        }
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT17(local_2f8[0x17],
                                   CONCAT16(local_2f8[0x16],
                                            CONCAT15(local_2f8[0x15],
                                                     CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) +
                          1);
        }
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,
                          CONCAT17(local_320[0]._M_local_buf[7],
                                   CONCAT16(local_320[0]._M_local_buf[6],
                                            CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_320[0]._M_allocated_capacity)
                                           )) + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,
                   "func $Handler$(srv interface{}, stream $grpc$.ServerStream) error {\n");
        (*printer->_vptr_Printer[5])(printer);
        iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])();
        pcVar31 = "return srv.($Service$Server).$Method$(&$StreamType${stream})\n";
        if ((char)iVar13 == '\0') {
          iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             ();
          pcVar31 = "return srv.($Service$Server).$Method$(&$StreamType${stream})\n";
          if ((char)iVar13 != '\0') {
            (*printer->_vptr_Printer[2])(printer,&local_1d8,"m := new($Request$)\n");
            local_3c8._0_8_ = local_3c8 + 0x10;
            local_3c8._16_4_ = 0x6f727245;
            local_3c8._20_2_ = 0x5f72;
            local_3c8[0x16] = 'C';
            stack0xfffffffffffffc4f = 0x6b636568;
            local_3c8._8_8_ = 0xb;
            uStack_3ad = '\0';
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_1d8,(key_type *)local_3c8);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3903dc);
            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
              operator_delete((void *)local_3c8._0_8_,
                              CONCAT17(local_3c8[0x17],
                                       CONCAT16(local_3c8[0x16],
                                                CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_3c8,&local_1d8);
            GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_3c8,false);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3c8);
            pcVar31 = "return srv.($Service$Server).$Method$(m, &$StreamType${stream})\n";
          }
        }
        (*printer->_vptr_Printer[2])(printer,&local_1d8,pcVar31);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])();
        cVar12 = '\x01';
        if ((char)iVar13 == '\0') {
          iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             ();
          if ((char)iVar13 == '\0') {
            iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x11]
                     )();
            cVar12 = (char)iVar13;
          }
          else {
            cVar12 = '\0';
          }
        }
        iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])();
        bVar30 = 1;
        if ((char)iVar13 == '\0') {
          iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             ();
          if ((char)iVar13 == '\0') {
            bVar30 = 0;
          }
          else {
            iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x11]
                     )();
            bVar30 = (byte)iVar13 ^ 1;
          }
        }
        iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])();
        if ((char)iVar13 == '\0') {
          bVar28 = 0;
        }
        else {
          iVar13 = (*((CommentHolder *)&local_300->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             ();
          bVar28 = (byte)iVar13 ^ 1;
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,"type $Service$_$Method$Server interface {\n");
        (*printer->_vptr_Printer[5])(printer);
        if (cVar12 != '\0') {
          (*printer->_vptr_Printer[2])(printer,&local_1d8,"Send(*$Response$) error\n");
        }
        if (bVar30 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_1d8,"Recv() (*$Request$, error)\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_1d8,"SendAndClose(*$Response$) error\n");
        }
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"$grpc$.ServerStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"type $StreamType$ struct {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"$grpc$.ServerStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        if (cVar12 != '\0') {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d8,"func (x *$StreamType$) Send(m *$Response$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[3])(printer,"return x.ServerStream.SendMsg(m)\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar30 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d8,"func (x *$StreamType$) Recv() (*$Request$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])(printer,&local_1d8,"m := new($Request$)\n");
          local_398._0_8_ = local_398 + 0x10;
          local_398._16_4_ = 0x6f727245;
          local_398._20_2_ = 0x5f72;
          local_398[0x16] = 'C';
          stack0xfffffffffffffc7f = 0x6b636568;
          local_398._8_8_ = 0xb;
          uStack_37d = '\0';
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_1d8,(key_type *)local_398);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3905a1);
          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
            operator_delete((void *)local_398._0_8_,
                            CONCAT17(local_398[0x17],
                                     CONCAT16(local_398[0x16],
                                              CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_398,&local_1d8);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_398,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_398);
          (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d8,
                     "func (x *$StreamType$) SendAndClose(m *$Response$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[3])(printer,"return x.ServerStream.SendMsg(m)\n");
          (*printer->_vptr_Printer[6])(printer);
          pcVar31 = ")\n}\n\n";
          goto LAB_0034a7c4;
        }
      }
      else {
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,
                   "func $Handler$(srv interface{}, ctx $context$.Context,\n\tdec func(interface{}) error, interceptor $grpc$.UnaryServerInterceptor) (interface{}, error) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"in := new($Request$)\n");
        local_3c8._16_4_ = 0x6f727245;
        local_3c8._20_2_ = 0x5f72;
        local_3c8[0x16] = 'C';
        stack0xfffffffffffffc4f = 0x6b636568;
        local_3c8._8_8_ = 0xb;
        uStack_3ad = '\0';
        local_3c8._0_8_ = local_3c8 + 0x10;
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d8,(key_type *)local_3c8);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x390208);
        if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
          operator_delete((void *)local_3c8._0_8_,
                          CONCAT17(local_3c8[0x17],
                                   CONCAT16(local_3c8[0x16],
                                            CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3c8,&local_1d8);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_3c8,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_3c8);
        (*printer->_vptr_Printer[3])(printer,"if interceptor == nil {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,"return srv.($Service$Server).$Method$(ctx, in)\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"info := &$grpc$.UnaryServerInfo{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[3])(printer,"Server:     srv,\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d8,"FullMethod: \"$FullMethodName$\",\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,
                   "handler := func(ctx $context$.Context, req interface{}) (interface{}, error) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d8,
                   "return srv.($Service$Server).$Method$(ctx, req.(*$Request$))\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        (*printer->_vptr_Printer[3])(printer,"return interceptor(ctx, in, info, handler)\n");
        (*printer->_vptr_Printer[6])(printer);
        pcVar31 = "\t\t}\n";
LAB_0034a7c4:
        (*printer->_vptr_Printer[3])(printer,pcVar31 + 2);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      if (local_220 != (CommentHolder *)0x0) {
        (*((CommentHolder *)&local_220->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
      }
      pSVar29 = local_218;
      iVar13 = local_224 + 1;
      iVar14 = (*(local_218->super_CommentHolder)._vptr_CommentHolder[8])(local_218);
    } while (iVar13 < iVar14);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"ServiceName: \"$ServicePrefix$$Service$\",\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"HandlerType: (*$Service$Server)(nil),\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"Methods: []$grpc$.MethodDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
  if (0 < iVar13) {
    uVar25 = 0;
    do {
      (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[9])(&local_248,pSVar29,uVar25);
      (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x28))(&local_188);
      pcVar31 = local_188;
      uVar6 = stack0xfffffffffffffc4f;
      if (local_180 == 0) {
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_177 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_177 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_177 >> 0x18);
        local_3c8._8_8_ = local_180;
        if (local_188 == &local_178) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_177,local_178);
          uStack_3b0 = (undefined3)uStack_170;
          uStack_3ad = (undefined1)((ulong)uStack_170 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_170 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_188;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_177,local_178);
          uStack_3b0 = SUB43(uVar6,1);
        }
      }
      else {
        iVar13 = toupper((int)*local_188);
        uVar6 = stack0xfffffffffffffc4f;
        *pcVar31 = (char)iVar13;
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_177 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_177 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_177 >> 0x18);
        if (local_188 == &local_178) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_177,local_178);
          uStack_3b0 = (undefined3)uStack_170;
          uStack_3ad = (undefined1)((ulong)uStack_170 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_170 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_188;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_177,local_178);
          uStack_3b0 = SUB43(uVar6,1);
        }
        local_3c8._8_8_ = local_180;
        p_Var27 = local_368;
      }
      local_188 = &local_178;
      local_180 = 0;
      local_178 = '\0';
      local_398._0_8_ = local_398 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Method","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,(key_type *)local_398);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
      }
      local_2f8._0_8_ = local_2f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Service","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,(key_type *)local_2f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     "_",pmVar15);
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)local_330);
      local_360._0_8_ = local_360 + 0x10;
      pCVar23 = (CommentHolder *)(puVar17 + 2);
      if ((CommentHolder *)*puVar17 == pCVar23) {
        local_360._16_4_ = *(undefined4 *)&pCVar23->_vptr_CommentHolder;
        uVar6 = *(undefined4 *)((long)puVar17 + 0x14);
        uVar7 = *(undefined4 *)(puVar17 + 3);
        uVar8 = *(undefined4 *)((long)puVar17 + 0x1c);
        local_360._20_2_ = (undefined2)uVar6;
        local_360[0x16] = (undefined1)((uint)uVar6 >> 0x10);
        local_360[0x17] = (undefined1)((uint)uVar6 >> 0x18);
        local_360[0x18] = (undefined1)uVar7;
        local_360._25_2_ = (undefined2)((uint)uVar7 >> 8);
        local_360[0x1b] = (undefined1)((uint)uVar7 >> 0x18);
        local_360._28_2_ = (undefined2)uVar8;
        local_360[0x1e] = (undefined1)((uint)uVar8 >> 0x10);
        local_360[0x1f] = (undefined1)((uint)uVar8 >> 0x18);
      }
      else {
        pp_Var5 = pCVar23->_vptr_CommentHolder;
        local_360._16_4_ = SUB84(pp_Var5,0);
        local_360._20_2_ = (undefined2)((ulong)pp_Var5 >> 0x20);
        local_360[0x16] = (undefined1)((ulong)pp_Var5 >> 0x30);
        local_360[0x17] = (undefined1)((ulong)pp_Var5 >> 0x38);
        local_360._0_8_ = (CommentHolder *)*puVar17;
      }
      local_360._8_8_ = puVar17[1];
      *puVar17 = pCVar23;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Method","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,(key_type *)local_278);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  (local_360,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_398._0_8_ = local_398 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_380 = (undefined3)lVar10;
        uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
        uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
        uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
      }
      else {
        lVar1 = *plVar19;
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_398._0_8_ = (long *)*plVar16;
      }
      local_398._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_398);
      local_3c8._0_8_ = local_3c8 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_3c8._16_4_ = (undefined4)*plVar19;
        uVar6 = *(undefined4 *)((long)plVar16 + 0x14);
        uStack_3ac = *(undefined4 *)((long)plVar16 + 0x1c);
        local_3c8._20_2_ = (undefined2)uVar6;
        local_3c8[0x16] = (undefined1)((uint)uVar6 >> 0x10);
        uStack_3b0 = (undefined3)(int)plVar16[3];
        unique0x10004744 = CONCAT31(uStack_3b0,(char)((uint)uVar6 >> 0x18));
        uStack_3ad = (undefined1)((uint)(int)plVar16[3] >> 0x18);
      }
      else {
        lVar1 = *plVar19;
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3c8._0_8_ = (long *)*plVar16;
      }
      local_3c8._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Handler","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,&local_298);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT17(local_298.field_2._M_local_buf[7],
                                 CONCAT16(local_298.field_2._M_local_buf[6],
                                          CONCAT24(local_298.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                                            CONCAT21(local_298.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_298.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,
                        CONCAT17(local_278[0x17],
                                 CONCAT25(local_278._21_2_,
                                          CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
      }
      if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT17(local_2f8[0x17],
                                 CONCAT16(local_2f8[0x16],
                                          CONCAT15(local_2f8[0x15],
                                                   CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) + 1
                       );
      }
      cVar12 = (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x78))();
      if (cVar12 != '\0') {
        (*printer->_vptr_Printer[3])(printer,"{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,p_Var27,"MethodName: \"$Method$\",\n");
        (*printer->_vptr_Printer[2])(printer,p_Var27,"Handler:    $Handler$,\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"},\n");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 8))();
      }
      pSVar29 = local_218;
      uVar24 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(local_218->super_CommentHolder)._vptr_CommentHolder[8])(local_218);
    } while ((int)uVar24 < iVar13);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"},\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"Streams: []$grpc$.StreamDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  iVar13 = (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[8])(pSVar29);
  if (0 < iVar13) {
    uVar25 = 0;
    do {
      (*(pSVar29->super_CommentHolder)._vptr_CommentHolder[9])(&local_248,pSVar29,uVar25);
      (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x28))(&local_148);
      pcVar31 = local_148;
      uVar6 = stack0xfffffffffffffc4f;
      if (local_140 == 0) {
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_137 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_137 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_137 >> 0x18);
        if (local_148 == &local_138) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_137,local_138);
          uStack_3b0 = (undefined3)uStack_130;
          uStack_3ad = (undefined1)((ulong)uStack_130 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_130 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_148;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_137,local_138);
          uStack_3b0 = SUB43(uVar6,1);
        }
        local_3c8._8_8_ = local_140;
      }
      else {
        iVar13 = toupper((int)*local_148);
        uVar6 = stack0xfffffffffffffc4f;
        *pcVar31 = (char)iVar13;
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8[0x16] = (undefined1)((uint7)uStack_137 >> 0x28);
        local_3c8[0x17] = (undefined1)((uint7)uStack_137 >> 0x30);
        local_3c8._20_2_ = (undefined2)((uint7)uStack_137 >> 0x18);
        if (local_148 == &local_138) {
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_137,local_138);
          uStack_3b0 = (undefined3)uStack_130;
          uStack_3ad = (undefined1)((ulong)uStack_130 >> 0x18);
          uStack_3ac = (undefined4)((ulong)uStack_130 >> 0x20);
        }
        else {
          local_3c8._0_8_ = local_148;
          local_3c8._16_4_ = (undefined4)CONCAT71(uStack_137,local_138);
          uStack_3b0 = SUB43(uVar6,1);
        }
        local_3c8._8_8_ = local_140;
      }
      local_140 = 0;
      local_138 = '\0';
      local_398._0_8_ = local_398 + 0x10;
      local_148 = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Method","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_368,(key_type *)local_398);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
      }
      local_2f8._0_8_ = local_2f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Service","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_368,(key_type *)local_2f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     "_",pmVar15);
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)local_330);
      local_360._0_8_ = local_360 + 0x10;
      pCVar23 = (CommentHolder *)(puVar17 + 2);
      if ((CommentHolder *)*puVar17 == pCVar23) {
        local_360._16_4_ = *(undefined4 *)&pCVar23->_vptr_CommentHolder;
        uVar6 = *(undefined4 *)((long)puVar17 + 0x14);
        uVar7 = *(undefined4 *)(puVar17 + 3);
        uVar8 = *(undefined4 *)((long)puVar17 + 0x1c);
        local_360._20_2_ = (undefined2)uVar6;
        local_360[0x16] = (undefined1)((uint)uVar6 >> 0x10);
        local_360[0x17] = (undefined1)((uint)uVar6 >> 0x18);
        local_360[0x18] = (undefined1)uVar7;
        local_360._25_2_ = (undefined2)((uint)uVar7 >> 8);
        local_360[0x1b] = (undefined1)((uint)uVar7 >> 0x18);
        local_360._28_2_ = (undefined2)uVar8;
        local_360[0x1e] = (undefined1)((uint)uVar8 >> 0x10);
        local_360[0x1f] = (undefined1)((uint)uVar8 >> 0x18);
      }
      else {
        pp_Var5 = pCVar23->_vptr_CommentHolder;
        local_360._16_4_ = SUB84(pp_Var5,0);
        local_360._20_2_ = (undefined2)((ulong)pp_Var5 >> 0x20);
        local_360[0x16] = (undefined1)((ulong)pp_Var5 >> 0x30);
        local_360[0x17] = (undefined1)((ulong)pp_Var5 >> 0x38);
        local_360._0_8_ = (CommentHolder *)*puVar17;
      }
      local_360._8_8_ = puVar17[1];
      *puVar17 = pCVar23;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Method","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_368,(key_type *)local_278);
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  (local_360,(ulong)(pmVar15->_M_dataplus)._M_p);
      local_398._0_8_ = local_398 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        lVar1 = *plVar19;
        lVar10 = plVar16[3];
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_380 = (undefined3)lVar10;
        uStack_37d = (undefined1)((ulong)lVar10 >> 0x18);
        uStack_37c = (undefined2)((ulong)lVar10 >> 0x20);
        uStack_37a = (undefined1)((ulong)lVar10 >> 0x30);
        uStack_379 = (undefined1)((ulong)lVar10 >> 0x38);
      }
      else {
        lVar1 = *plVar19;
        local_398._16_4_ = (undefined4)lVar1;
        local_398._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_398[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_398[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_398._0_8_ = (long *)*plVar16;
      }
      local_398._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_398);
      local_3c8._0_8_ = local_3c8 + 0x10;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_3c8._16_4_ = (undefined4)*plVar19;
        uVar6 = *(undefined4 *)((long)plVar16 + 0x14);
        uStack_3ac = *(undefined4 *)((long)plVar16 + 0x1c);
        local_3c8._20_2_ = (undefined2)uVar6;
        local_3c8[0x16] = (undefined1)((uint)uVar6 >> 0x10);
        uStack_3b0 = (undefined3)(int)plVar16[3];
        unique0x10004748 = CONCAT31(uStack_3b0,(char)((uint)uVar6 >> 0x18));
        uStack_3ad = (undefined1)((uint)(int)plVar16[3] >> 0x18);
      }
      else {
        lVar1 = *plVar19;
        local_3c8._16_4_ = (undefined4)lVar1;
        local_3c8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3c8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3c8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3c8._0_8_ = (long *)*plVar16;
      }
      local_3c8._8_8_ = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Handler","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_368,&local_298);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT17(local_298.field_2._M_local_buf[7],
                                 CONCAT16(local_298.field_2._M_local_buf[6],
                                          CONCAT24(local_298.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                                            CONCAT21(local_298.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_298.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
        operator_delete((void *)local_3c8._0_8_,
                        CONCAT17(local_3c8[0x17],
                                 CONCAT16(local_3c8[0x16],
                                          CONCAT24(local_3c8._20_2_,local_3c8._16_4_))) + 1);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,
                        CONCAT17(local_398[0x17],
                                 CONCAT16(local_398[0x16],
                                          CONCAT24(local_398._20_2_,local_398._16_4_))) + 1);
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,
                        CONCAT17(local_278[0x17],
                                 CONCAT25(local_278._21_2_,
                                          CONCAT14(local_278[0x14],local_278._16_4_))) + 1);
      }
      if ((CommentHolder *)local_360._0_8_ != (CommentHolder *)(local_360 + 0x10)) {
        operator_delete((void *)local_360._0_8_,
                        CONCAT17(local_360[0x17],
                                 CONCAT16(local_360[0x16],
                                          CONCAT24(local_360._20_2_,local_360._16_4_))) + 1);
      }
      if (local_330 != (undefined1  [8])local_320) {
        operator_delete((void *)local_330,
                        CONCAT17(local_320[0]._M_local_buf[7],
                                 CONCAT16(local_320[0]._M_local_buf[6],
                                          CONCAT24(local_320[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_320[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT17(local_2f8[0x17],
                                 CONCAT16(local_2f8[0x16],
                                          CONCAT15(local_2f8[0x15],
                                                   CONCAT14(local_2f8[0x14],local_2f8._16_4_)))) + 1
                       );
      }
      cVar12 = (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x78))();
      if (cVar12 == '\0') {
        (*printer->_vptr_Printer[3])(printer,"{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,local_368,"StreamName:    \"$Method$\",\n");
        (*printer->_vptr_Printer[2])(printer,local_368,"Handler:       $Handler$,\n");
        _Var11._M_p = local_248._M_dataplus._M_p;
        cVar12 = (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x80))
                           (local_248._M_dataplus._M_p);
        if (cVar12 == '\0') {
LAB_0034b269:
          _Var11._M_p = local_248._M_dataplus._M_p;
          cVar12 = (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 0x80))
                             (local_248._M_dataplus._M_p);
          if (cVar12 == '\0') {
            cVar12 = (**(code **)(*(size_type *)_Var11._M_p + 0x88))(_Var11._M_p);
            pcVar31 = "ServerStreams: true,\n";
            if (cVar12 != '\0') goto LAB_0034b2af;
          }
          (*printer->_vptr_Printer[3])(printer,"ServerStreams: true,\n");
          pcVar31 = "ClientStreams: true,\n";
        }
        else {
          cVar12 = (**(code **)(*(size_type *)_Var11._M_p + 0x88))(_Var11._M_p);
          pcVar31 = "ClientStreams: true,\n";
          if (cVar12 != '\0') goto LAB_0034b269;
        }
LAB_0034b2af:
        (*printer->_vptr_Printer[3])(printer,pcVar31);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"},\n");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_248._M_dataplus._M_p + 8))();
      }
      pSVar29 = local_218;
      uVar24 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar24;
      iVar13 = (*(local_218->super_CommentHolder)._vptr_CommentHolder[8])(local_218);
    } while ((int)uVar24 < iVar13);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"},\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n");
  return;
}

Assistant:

void GenerateService(const grpc_generator::Service *service,
                     grpc_generator::Printer *printer,
                     std::map<grpc::string, grpc::string> vars) {
  vars["Service"] = exportName(service->name());
  // Client Interface
  printer->Print(vars, "// Client API for $Service$ service\n");
  printer->Print(vars, "type $Service$Client interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateClientMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Outdent();
  printer->Print("}\n\n");

  // Client structure
  vars["ServiceUnexported"] = unexportName(vars["Service"]);
  printer->Print(vars, "type $ServiceUnexported$Client struct {\n");
  printer->Indent();
  printer->Print(vars, "cc $grpc$.ClientConnInterface\n");
  printer->Outdent();
  printer->Print("}\n\n");

  // NewClient
  printer->Print(vars,
                 "func New$Service$Client(cc $grpc$.ClientConnInterface) "
                 "$Service$Client {\n");
  printer->Indent();
  printer->Print(vars, "return &$ServiceUnexported$Client{cc}");
  printer->Outdent();
  printer->Print("\n}\n\n");

  int unary_methods = 0, streaming_methods = 0;
  vars["ServiceDesc"] = "_" + vars["Service"] + "_serviceDesc";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    if (method->NoStreaming()) {
      vars["MethodDesc"] =
          vars["ServiceDesc"] + ".Method[" + as_string(unary_methods) + "]";
      unary_methods++;
    } else {
      vars["MethodDesc"] = vars["ServiceDesc"] + ".Streams[" +
                           as_string(streaming_methods) + "]";
      streaming_methods++;
    }
    GenerateClientMethod(method.get(), printer, vars);
  }

  // Server Interface
  printer->Print(vars, "// Server API for $Service$ service\n");
  printer->Print(vars, "type $Service$Server interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");

  printer->Print(vars, "type Unimplemented$Service$Server struct {\n");
  printer->Print("}\n\n");

  vars["Ending"] = " {\n";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Nil"] = method->NoStreaming() ? "nil, " : "";
    printer->Print(vars, "func (Unimplemented$Service$Server) ");
    GenerateServerMethodSignature(method.get(), printer, vars);
    printer->Indent();
    printer->Print(vars,
                   "return $Nil$status.Errorf(codes.Unimplemented, \"method "
                   "$Method$ not implemented\")\n");
    printer->Outdent();
    printer->Print("}\n");
    printer->Print("\n");
  }

  printer->Print(vars,
                 "func (Unimplemented$Service$Server) "
                 "mustEmbedUnimplemented$Service$Server() {}");
  printer->Print("\n\n");

  printer->Print(vars, "type Unsafe$Service$Server interface {\n");
  printer->Indent();
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");
  // Server registration.
  printer->Print(vars,
                 "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv "
                 "$Service$Server) {\n");
  printer->Indent();
  printer->Print(vars, "s.RegisterService(&$ServiceDesc$, srv)\n");
  printer->Outdent();
  printer->Print("}\n\n");

  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethod(service->method(i).get(), printer, vars);
  }

  // Service Descriptor
  printer->Print(vars, "var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  printer->Indent();
  printer->Print(vars, "ServiceName: \"$ServicePrefix$$Service$\",\n");
  printer->Print(vars, "HandlerType: (*$Service$Server)(nil),\n");
  printer->Print(vars, "Methods: []$grpc$.MethodDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "MethodName: \"$Method$\",\n");
      printer->Print(vars, "Handler:    $Handler$,\n");
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Print(vars, "Streams: []$grpc$.StreamDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (!method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "StreamName:    \"$Method$\",\n");
      printer->Print(vars, "Handler:       $Handler$,\n");
      if (ClientOnlyStreaming(method.get())) {
        printer->Print("ClientStreams: true,\n");
      } else if (ServerOnlyStreaming(method.get())) {
        printer->Print("ServerStreams: true,\n");
      } else {
        printer->Print("ServerStreams: true,\n");
        printer->Print("ClientStreams: true,\n");
      }
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Outdent();
  printer->Print("}\n");
}